

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O1

void mxx::impl::all2allv_big<std::array<unsigned_long,3ul>>
               (array<unsigned_long,_3UL> *msgs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
               array<unsigned_long,_3UL> *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  unsigned_long uVar1;
  MPI_Comm poVar2;
  ulong uVar3;
  MPI_Datatype poVar4;
  MPI_Request *ppoVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  datatype dt_1;
  requests reqs;
  datatype dt;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_displs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_displs;
  datatype local_c8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_b0;
  requests local_a8;
  array<unsigned_long,_3UL> *local_88;
  array<unsigned_long,_3UL> *local_80;
  datatype local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_b0 = send_sizes;
  local_88 = msgs;
  local_80 = out;
  if (comm->m_size !=
      (int)((ulong)((long)(send_sizes->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(send_sizes->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_a8);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
           (ulong)local_a8._vptr_requests & 0xffffffff,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
           ,0x111,"all2allv_big","static_cast<int>(send_sizes.size()) == comm.size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  if (comm->m_size !=
      (int)((ulong)((long)(recv_sizes->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_finish -
                   (long)(recv_sizes->
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&local_a8);
    printf("\n[Rank %d] %s:%d: %s: Assertion `%s` failed. Aborting.\n",
           (ulong)local_a8._vptr_requests & 0xffffffff,
           "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/big_collective.hpp"
           ,0x112,"all2allv_big","static_cast<int>(recv_sizes.size()) == comm.size()");
    fflush(_stdout);
    MPI_Abort(&ompi_mpi_comm_world,0xffffffff);
  }
  get_displacements<unsigned_long>(&local_48,local_b0);
  get_displacements<unsigned_long>(&local_60,recv_sizes);
  local_a8._vptr_requests = (_func_int **)&PTR__requests_0013d9e8;
  local_a8.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.m_requests.super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar7 = comm->m_size;
  if (0 < iVar7) {
    iVar6 = 0;
    iVar8 = 0;
    do {
      uVar3 = (long)(comm->m_rank + iVar7 + iVar6) % (long)iVar7;
      local_c8.mpitype = datatype_builder<std::array<unsigned_long,_3UL>_>::get_type();
      local_c8._vptr_datatype = (_func_int **)&PTR__datatype_0013d8d8;
      local_c8.builtin = false;
      iVar7 = (int)uVar3;
      datatype::contiguous
                (&local_78,&local_c8,
                 (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[iVar7]);
      datatype::~datatype(&local_c8);
      poVar4 = local_78.mpitype;
      uVar1 = local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[iVar7];
      poVar2 = comm->mpi_comm;
      ppoVar5 = requests::add(&local_a8);
      MPI_Irecv(local_80 + uVar1,1,poVar4,uVar3 & 0xffffffff,0x3039,poVar2,ppoVar5);
      datatype::~datatype(&local_78);
      iVar8 = iVar8 + 1;
      iVar7 = comm->m_size;
      iVar6 = iVar6 + -1;
    } while (iVar8 < iVar7);
  }
  iVar7 = comm->m_size;
  if (0 < iVar7) {
    iVar6 = 0;
    do {
      uVar3 = (long)(comm->m_rank + iVar6) % (long)iVar7;
      local_c8.mpitype = datatype_builder<std::array<unsigned_long,_3UL>_>::get_type();
      local_c8._vptr_datatype = (_func_int **)&PTR__datatype_0013d8d8;
      local_c8.builtin = false;
      iVar7 = (int)uVar3;
      datatype::contiguous
                (&local_78,&local_c8,
                 (local_b0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start[iVar7]);
      datatype::~datatype(&local_c8);
      poVar4 = local_78.mpitype;
      uVar1 = local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[iVar7];
      poVar2 = comm->mpi_comm;
      ppoVar5 = requests::add(&local_a8);
      MPI_Isend(local_88 + uVar1,1,poVar4,uVar3 & 0xffffffff,0x3039,poVar2,ppoVar5);
      datatype::~datatype(&local_78);
      iVar6 = iVar6 + 1;
      iVar7 = comm->m_size;
    } while (iVar6 < iVar7);
  }
  MPI_Waitall((ulong)((long)local_a8.m_requests.
                            super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_a8.m_requests.
                           super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3,
              local_a8.m_requests.
              super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
              super__Vector_impl_data._M_start,0);
  requests::~requests(&local_a8);
  if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void all2allv_big(const T* msgs, const std::vector<size_t>& send_sizes, T* out, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    // point-to-point implementation
    // TODO: implement MPI_Alltoallw variant
    // TODO: try RMA
    MXX_ASSERT(static_cast<int>(send_sizes.size()) == comm.size());
    MXX_ASSERT(static_cast<int>(recv_sizes.size()) == comm.size());
    std::vector<size_t> send_displs = get_displacements(send_sizes);
    std::vector<size_t> recv_displs = get_displacements(recv_sizes);
    // TODO: unify tag usage
    int tag = 12345;
    // implementing this using point-to-point communication!
    // dispatch receives
    mxx::requests reqs;
    for (int i = 0; i < comm.size(); ++i) {
        // start with self send/recv
        int recv_from = (comm.rank() + (comm.size()-i)) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_sizes[recv_from]);
        MPI_Irecv(const_cast<T*>(&(*out)) + recv_displs[recv_from], 1, dt.type(),
                  recv_from, tag, comm, &reqs.add());
    }
    // dispatch sends
    for (int i = 0; i < comm.size(); ++i) {
        int send_to = (comm.rank() + i) % comm.size();
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(send_sizes[send_to]);
        MPI_Isend(const_cast<T*>(msgs)+send_displs[send_to], 1, dt.type(), send_to,
                  tag, comm, &reqs.add());
    }

    reqs.wait();
}